

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O1

void __thiscall CClassList::Add(CClassList *this,CClass *cClass)

{
  __uniq_ptr_impl<CClass,_std::default_delete<CClass>_> local_10;
  
  local_10._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
  super__Head_base<0UL,_CClass_*,_false>._M_head_impl =
       (tuple<CClass_*,_std::default_delete<CClass>_>)
       (tuple<CClass_*,_std::default_delete<CClass>_>)cClass;
  std::
  vector<std::unique_ptr<CClass,std::default_delete<CClass>>,std::allocator<std::unique_ptr<CClass,std::default_delete<CClass>>>>
  ::emplace_back<std::unique_ptr<CClass,std::default_delete<CClass>>>
            ((vector<std::unique_ptr<CClass,std::default_delete<CClass>>,std::allocator<std::unique_ptr<CClass,std::default_delete<CClass>>>>
              *)&this->classes,(unique_ptr<CClass,_std::default_delete<CClass>_> *)&local_10);
  if ((_Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>)
      local_10._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
      super__Head_base<0UL,_CClass_*,_false>._M_head_impl != (CClass *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
                          super__Head_base<0UL,_CClass_*,_false>._M_head_impl + 0x10))();
  }
  return;
}

Assistant:

void CClassList::Add(CClass* cClass) {
	classes.push_back(std::unique_ptr<CClass>(cClass));
}